

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

int linenoiseHistorySetMaxLen(int len)

{
  int iVar1;
  char **__ptr;
  uint uVar2;
  char **__s;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  __ptr = history;
  iVar1 = history_len;
  iVar3 = 0;
  if (0 < len) {
    if (history != (char **)0x0) {
      __s = (char **)malloc((ulong)(uint)len << 3);
      if (__s == (char **)0x0) {
        return 0;
      }
      uVar4 = iVar1 - len;
      iVar3 = iVar1;
      uVar2 = 0;
      if ((uVar4 != 0 && len <= iVar1) && (iVar3 = len, uVar2 = uVar4, uVar4 != 0 && len <= iVar1))
      {
        uVar5 = 0;
        do {
          free(__ptr[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      memset(__s,0,(ulong)(uint)len << 3);
      memcpy(__s,__ptr + (int)uVar2,(long)iVar3 << 3);
      free(__ptr);
      history = __s;
    }
    iVar3 = 1;
    history_max_len = len;
    if (len < iVar1) {
      history_len = len;
    }
  }
  return iVar3;
}

Assistant:

int linenoiseHistorySetMaxLen(int len) {
    char **new;

    if (len < 1) return 0;
    if (history) {
        int tocopy = history_len;

        new = malloc(sizeof(char*)*len);
        if (new == NULL) return 0;

        /* If we can't copy everything, free the elements we'll not use. */
        if (len < tocopy) {
            int j;

            for (j = 0; j < tocopy-len; j++) free(history[j]);
            tocopy = len;
        }
        memset(new,0,sizeof(char*)*len);
        memcpy(new,history+(history_len-tocopy), sizeof(char*)*tocopy);
        free(history);
        history = new;
    }
    history_max_len = len;
    if (history_len > history_max_len)
        history_len = history_max_len;
    return 1;
}